

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

bool testing::Test::HasSameFixtureClass(void)

{
  TestInfo *pTVar1;
  TestInfo *pTVar2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  size_t sVar5;
  char *pcVar6;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar7;
  ostream *poVar8;
  char *pcVar9;
  char *__s;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  AssertHelper local_38;
  
  UnitTest::GetInstance();
  pTVar1 = (UnitTest::GetInstance::instance.impl_)->current_test_info_;
  pTVar2 = *((UnitTest::GetInstance::instance.impl_)->current_test_case_->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar3 = (undefined1 *)pTVar2->fixture_class_id_;
  puVar4 = (undefined1 *)pTVar1->fixture_class_id_;
  if (puVar4 != puVar3) {
    pcVar6 = (pTVar2->name_)._M_dataplus._M_p;
    __s = (pTVar1->name_)._M_dataplus._M_p;
    if ((puVar3 == &internal::TypeIdHelper<testing::Test>::dummy_) ||
       (puVar4 == &internal::TypeIdHelper<testing::Test>::dummy_)) {
      pcVar9 = pcVar6;
      if (puVar3 == &internal::TypeIdHelper<testing::Test>::dummy_) {
        pcVar9 = __s;
        __s = pcVar6;
      }
      Message::Message((Message *)&local_40);
      poVar8 = (ostream *)(local_40.ptr_ + 0x10);
      if (local_40.ptr_ ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        poVar8 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"All tests in the same test case must use the same test fixture\n",0x3f);
      poVar8 = (ostream *)(local_40.ptr_ + 0x10);
      if (local_40.ptr_ ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        poVar8 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"class, so mixing TEST_F and TEST in the same test case is\n",0x3a);
      poVar8 = (ostream *)(local_40.ptr_ + 0x10);
      if (local_40.ptr_ ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        poVar8 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"illegal.  In test case ",0x17);
      pcVar6 = (pTVar1->test_case_name_)._M_dataplus._M_p;
      if (pcVar6 == (char *)0x0) {
        sVar7.ptr_ = local_40.ptr_ + 0x10;
        sVar5 = 6;
        pcVar6 = "(null)";
      }
      else {
        sVar7.ptr_ = local_40.ptr_;
        if (local_40.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          sVar7.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_40.ptr_ + 0x10);
        }
        sVar5 = strlen(pcVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)sVar7.ptr_,pcVar6,sVar5);
      poVar8 = (ostream *)(local_40.ptr_ + 0x10);
      if (local_40.ptr_ ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        poVar8 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,",\n",2);
      poVar8 = (ostream *)(local_40.ptr_ + 0x10);
      if (local_40.ptr_ ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        poVar8 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"test ",5);
      if (pcVar9 == (char *)0x0) {
        sVar7.ptr_ = local_40.ptr_ + 0x10;
        sVar5 = 6;
        pcVar9 = "(null)";
      }
      else {
        sVar7.ptr_ = local_40.ptr_;
        if (local_40.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          sVar7.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_40.ptr_ + 0x10);
        }
        sVar5 = strlen(pcVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)sVar7.ptr_,pcVar9,sVar5);
      poVar8 = (ostream *)(local_40.ptr_ + 0x10);
      if (local_40.ptr_ ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        poVar8 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8," is defined using TEST_F but\n",0x1d);
      poVar8 = (ostream *)(local_40.ptr_ + 0x10);
      if (local_40.ptr_ ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        poVar8 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"test ",5);
      if (__s == (char *)0x0) {
        sVar7.ptr_ = local_40.ptr_ + 0x10;
        sVar5 = 6;
        __s = "(null)";
      }
      else {
        sVar7.ptr_ = local_40.ptr_;
        if (local_40.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          sVar7.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_40.ptr_ + 0x10);
        }
        sVar5 = strlen(__s);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)sVar7.ptr_,__s,sVar5);
      poVar8 = (ostream *)(local_40.ptr_ + 0x10);
      if (local_40.ptr_ ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        poVar8 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8," is defined using TEST.  You probably\n",0x26);
      poVar8 = (ostream *)(local_40.ptr_ + 0x10);
      if (local_40.ptr_ ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        poVar8 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"want to change the TEST to TEST_F or move it to another test\n",0x3d);
      poVar8 = (ostream *)(local_40.ptr_ + 0x10);
      if (local_40.ptr_ ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        poVar8 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"case.",5);
      internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/googletest/src/gtest.cc"
                 ,0x7bf,"Failed");
      internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    }
    else {
      Message::Message((Message *)&local_40);
      poVar8 = (ostream *)(local_40.ptr_ + 0x10);
      if (local_40.ptr_ ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        poVar8 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"All tests in the same test case must use the same test fixture\n",0x3f);
      poVar8 = (ostream *)(local_40.ptr_ + 0x10);
      if (local_40.ptr_ ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        poVar8 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"class.  However, in test case ",0x1e);
      pcVar9 = (pTVar1->test_case_name_)._M_dataplus._M_p;
      if (pcVar9 == (char *)0x0) {
        sVar7.ptr_ = local_40.ptr_ + 0x10;
        sVar5 = 6;
        pcVar9 = "(null)";
      }
      else {
        sVar7.ptr_ = local_40.ptr_;
        if (local_40.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          sVar7.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_40.ptr_ + 0x10);
        }
        sVar5 = strlen(pcVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)sVar7.ptr_,pcVar9,sVar5);
      poVar8 = (ostream *)(local_40.ptr_ + 0x10);
      if (local_40.ptr_ ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        poVar8 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,",\n",2);
      poVar8 = (ostream *)(local_40.ptr_ + 0x10);
      if (local_40.ptr_ ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        poVar8 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"you defined test ",0x11);
      if (pcVar6 == (char *)0x0) {
        sVar7.ptr_ = local_40.ptr_ + 0x10;
        sVar5 = 6;
        pcVar6 = "(null)";
      }
      else {
        sVar7.ptr_ = local_40.ptr_;
        if (local_40.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          sVar7.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_40.ptr_ + 0x10);
        }
        sVar5 = strlen(pcVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)sVar7.ptr_,pcVar6,sVar5);
      poVar8 = (ostream *)(local_40.ptr_ + 0x10);
      if (local_40.ptr_ ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        poVar8 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," and test ",10);
      if (__s == (char *)0x0) {
        sVar7.ptr_ = local_40.ptr_ + 0x10;
        sVar5 = 6;
        __s = "(null)";
      }
      else {
        sVar7.ptr_ = local_40.ptr_;
        if (local_40.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          sVar7.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_40.ptr_ + 0x10);
        }
        sVar5 = strlen(__s);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)sVar7.ptr_,__s,sVar5);
      poVar8 = (ostream *)(local_40.ptr_ + 0x10);
      if (local_40.ptr_ ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        poVar8 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      poVar8 = (ostream *)(local_40.ptr_ + 0x10);
      if (local_40.ptr_ ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        poVar8 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"using two different test fixture classes.  This can happen if\n",0x3e);
      poVar8 = (ostream *)(local_40.ptr_ + 0x10);
      if (local_40.ptr_ ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        poVar8 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"the two classes are from different namespaces or translation\n",0x3d);
      poVar8 = (ostream *)(local_40.ptr_ + 0x10);
      if (local_40.ptr_ ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        poVar8 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"units and have the same name.  You should probably rename one\n",0x3e);
      poVar8 = (ostream *)(local_40.ptr_ + 0x10);
      if (local_40.ptr_ ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        poVar8 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"of the classes to put the tests into different test cases.",0x3a);
      internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/googletest/src/gtest.cc"
                 ,0x7cb,"Failed");
      internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    }
    internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40.ptr_ + 8))();
    }
  }
  return puVar4 == puVar3;
}

Assistant:

static void StreamWideCharsToMessage(const wchar_t* wstr, size_t length,
                                     Message* msg) {
  // TODO(wan): consider allowing a testing::String object to
  // contain '\0'.  This will make it behave more like std::string,
  // and will allow ToUtf8String() to return the correct encoding
  // for '\0' s.t. we can get rid of the conditional here (and in
  // several other places).
  for (size_t i = 0; i != length; ) {  // NOLINT
    if (wstr[i] != L'\0') {
      *msg << WideStringToUtf8(wstr + i, static_cast<int>(length - i));
      while (i != length && wstr[i] != L'\0')
        i++;
    } else {
      *msg << '\0';
      i++;
    }
  }
}